

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_comm_bxor(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  TRef TVar3;
  cTValue *tv;
  IRRef1 tmp;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar2 = (J->fold).ins.field_0.op2;
  if (uVar1 == uVar2) {
    if ((0x604208U >> (*(uint *)((long)&(J->fold).ins + 4) & 0x1f) & 1) != 0) {
      tv = lj_ir_k64_find(J,0);
      TVar3 = lj_ir_k64(J,IR_KINT64,tv);
      return TVar3;
    }
    (J->fold).ins.field_1.op12 = 0;
    TVar3 = 2;
  }
  else {
    TVar3 = 0;
    if (uVar1 < uVar2) {
      (J->fold).ins.field_0.op1 = uVar2;
      (J->fold).ins.field_0.op2 = uVar1;
      TVar3 = 1;
    }
  }
  return TVar3;
}

Assistant:

LJFOLD(BXOR any any)
LJFOLDF(comm_bxor)
{
  if (fins->op1 == fins->op2)  /* i xor i ==> 0 */
    return irt_is64(fins->t) ? INT64FOLD(0) : INTFOLD(0);
  return fold_comm_swap(J);
}